

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_as_bool(void)

{
  byte bVar1;
  uint uVar2;
  bson_t b;
  bson_iter_t iter;
  undefined1 auStack_180 [128];
  undefined1 local_100 [248];
  
  bson_init(auStack_180);
  bson_append_int32(auStack_180,"int32[true]",0xffffffff,1);
  bson_append_int32(auStack_180,"int32[false]",0xffffffff,0);
  bson_append_int64(auStack_180,"int64[true]",0xffffffff,1);
  bson_append_int64(auStack_180,"int64[false]",0xffffffff,0);
  bson_append_double(0x3ff0000000000000,auStack_180,"int64[true]",0xffffffff);
  bson_append_double(0,auStack_180,"int64[false]",0xffffffff);
  bson_iter_init(local_100,auStack_180);
  bson_iter_next(local_100);
  bVar1 = bson_iter_as_bool(local_100);
  if ((bVar1 & 1) != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)true == bson_iter_as_bool (&iter)\n",0x246);
    abort();
  }
  bson_iter_next(local_100);
  uVar2 = bson_iter_as_bool(local_100);
  if ((uVar2 & 1) != 0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)false == bson_iter_as_bool (&iter)\n",0x248);
    abort();
  }
  bson_iter_next(local_100);
  bVar1 = bson_iter_as_bool(local_100);
  if ((bVar1 & 1) != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)true == bson_iter_as_bool (&iter)\n",0x24a);
    abort();
  }
  bson_iter_next(local_100);
  uVar2 = bson_iter_as_bool(local_100);
  if ((uVar2 & 1) != 0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)false == bson_iter_as_bool (&iter)\n",0x24c);
    abort();
  }
  bson_iter_next(local_100);
  bVar1 = bson_iter_as_bool(local_100);
  if ((bVar1 & 1) != 1) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)true == bson_iter_as_bool (&iter)\n",0x24e);
    abort();
  }
  bson_iter_next(local_100);
  uVar2 = bson_iter_as_bool(local_100);
  if ((uVar2 & 1) != 0) {
    fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)false == bson_iter_as_bool (&iter)\n",0x250);
    abort();
  }
  bson_destroy(auStack_180);
  return;
}

Assistant:

static void
test_bson_iter_as_bool (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   bson_append_int32 (&b, "int32[true]", -1, 1);
   bson_append_int32 (&b, "int32[false]", -1, 0);
   bson_append_int64 (&b, "int64[true]", -1, 1);
   bson_append_int64 (&b, "int64[false]", -1, 0);
   bson_append_double (&b, "int64[true]", -1, 1.0);
   bson_append_double (&b, "int64[false]", -1, 0.0);

   bson_iter_init (&iter, &b);
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (true, ==, bson_iter_as_bool (&iter));
   bson_iter_next (&iter);
   BSON_ASSERT_CMPINT (false, ==, bson_iter_as_bool (&iter));

   bson_destroy (&b);
}